

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleDemo_common.hpp
# Opt level: O3

void cos1D_testSaveLoadAndParamHandling<IMLE>(IMLE *imleObj)

{
  Param *this;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  Scal *pSVar4;
  Scal *pSVar5;
  byte bVar6;
  Param param;
  string local_f8;
  undefined1 local_d8 [136];
  _Alloc_hider local_50;
  char local_40 [24];
  
  bVar6 = 0;
  local_d8._16_8_ = (imleObj->param).alpha;
  local_d8._0_4_ = (imleObj->param).d;
  local_d8._4_4_ = (imleObj->param).D;
  local_d8[8] = (imleObj->param).accelerated;
  local_d8._9_7_ = *(undefined7 *)&(imleObj->param).field_0x9;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)(local_d8 + 0x18),
             (DenseStorage<double,__1,__1,_1,_0> *)&(imleObj->param).Psi0);
  pSVar4 = &(imleObj->param).sigma0;
  pSVar5 = (Scal *)(local_d8 + 0x28);
  for (lVar3 = 0xb; lVar3 != 0; lVar3 = lVar3 + -1) {
    *pSVar5 = *pSVar4;
    pSVar4 = pSVar4 + (ulong)bVar6 * -2 + 1;
    pSVar5 = pSVar5 + (ulong)bVar6 * -2 + 1;
  }
  local_d8[0x84] = (imleObj->param).saveOnExit;
  local_d8._128_4_ = (imleObj->param).iterMax;
  pcVar2 = (imleObj->param).defaultSave._M_dataplus._M_p;
  local_50._M_p = local_40;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (imleObj->param).defaultSave._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t-- Initial parameters: --",0x1a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  this = &imleObj->param;
  IMLE::Param::display(this,(ostream *)&std::cout);
  paVar1 = &local_f8.field_2;
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"cos1D.xml","");
  IMLE::loadParameters(imleObj,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t-- Now the IMLE object has default parameters: --",0x32);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  IMLE::Param::display(this,(ostream *)&std::cout);
  IMLE::setParameters(imleObj,(Param *)local_d8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\t-- Reverting to initial parameters: --",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  IMLE::Param::display(this,(ostream *)&std::cout);
  cos1D_train<IMLE>(imleObj,10);
  cos1D_display<IMLE>(imleObj);
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"cos1D_demo.imle","");
  IMLE::save(imleObj,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  IMLE::reset(imleObj);
  operator<<((ostream *)&std::cout,imleObj);
  cos1D_train<IMLE>(imleObj,0x14);
  cos1D_display<IMLE>(imleObj);
  local_f8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"cos1D_demo.imle","");
  IMLE::load(imleObj,&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  operator<<((ostream *)&std::cout,imleObj);
  if (local_50._M_p != local_40) {
    operator_delete(local_50._M_p);
  }
  free((void *)local_d8._24_8_);
  return;
}

Assistant:

void cos1D_testSaveLoadAndParamHandling( Learner &imleObj )
{
	// Parameter handling
	typename Learner::Param param = imleObj.getParameters();
	cout << "\t-- Initial parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.loadParameters("cos1D.xml");
	cout << "\t-- Now the IMLE object has default parameters: --" << endl;
	imleObj.displayParameters();

	imleObj.setParameters(param);
	cout << "\t-- Reverting to initial parameters: --" << endl;
	imleObj.displayParameters();

	// Training (10 points)
    cos1D_train(imleObj, 10);

    // Display info
    cos1D_display(imleObj);

    // Save
    imleObj.save("cos1D_demo.imle");

    // Reset
    imleObj.reset();
    cout << imleObj;

    // Train again
    cos1D_train(imleObj, 20);
    cos1D_display(imleObj);

    // Load
    imleObj.load("cos1D_demo.imle");
    cout << imleObj;
}